

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_unicode.c
# Opt level: O0

int PHYSFS_caseFold(PHYSFS_uint32 from,PHYSFS_uint32 *to)

{
  byte bVar1;
  PHYSFS_uint16 PVar2;
  uint uVar3;
  CaseFoldMapping2_16 *pCVar4;
  CaseFoldMapping3_16 *pCVar5;
  CaseFoldMapping1_32 *mapping_3;
  int count_3;
  CaseFoldHashBucket1_32 *bucket_3;
  PHYSFS_uint8 hash_1;
  CaseFoldMapping3_16 *mapping_2;
  int count_2;
  CaseFoldHashBucket3_16 *bucket_2;
  CaseFoldMapping2_16 *mapping_1;
  int count_1;
  CaseFoldHashBucket2_16 *bucket_1;
  CaseFoldMapping1_16 *mapping;
  int count;
  CaseFoldHashBucket1_16 *bucket;
  PHYSFS_uint16 from16;
  PHYSFS_uint8 hash;
  int i;
  PHYSFS_uint32 *to_local;
  PHYSFS_uint32 from_local;
  
  if (from < 0x80) {
    if ((from < 0x41) || (0x5a < from)) {
      *to = from;
    }
    else {
      *to = from + 0x20;
    }
  }
  else {
    bVar1 = (byte)(from >> 8);
    if (from < 0x10000) {
      bVar1 = (byte)from ^ bVar1;
      PVar2 = (PHYSFS_uint16)from;
      for (bucket._4_4_ = 0; bucket._4_4_ < (int)(uint)case_fold_hash1_16[bVar1].count;
          bucket._4_4_ = bucket._4_4_ + 1) {
        if (case_fold_hash1_16[bVar1].list[bucket._4_4_].from == PVar2) {
          *to = (uint)case_fold_hash1_16[bVar1].list[bucket._4_4_].to0;
          return 1;
        }
      }
      for (bucket._4_4_ = 0; bucket._4_4_ < (int)(uint)case_fold_hash2_16[(int)(bVar1 & 0xf)].count;
          bucket._4_4_ = bucket._4_4_ + 1) {
        pCVar4 = case_fold_hash2_16[(int)(bVar1 & 0xf)].list + bucket._4_4_;
        if (pCVar4->from == PVar2) {
          *to = (uint)pCVar4->to0;
          to[1] = (uint)pCVar4->to1;
          return 2;
        }
      }
      for (bucket._4_4_ = 0; bucket._4_4_ < (int)(uint)case_fold_hash3_16[(int)(bVar1 & 3)].count;
          bucket._4_4_ = bucket._4_4_ + 1) {
        pCVar5 = case_fold_hash3_16[(int)(bVar1 & 3)].list + bucket._4_4_;
        if (pCVar5->from == PVar2) {
          *to = (uint)pCVar5->to0;
          to[1] = (uint)pCVar5->to1;
          to[2] = (uint)pCVar5->to2;
          return 3;
        }
      }
    }
    else {
      uVar3 = (byte)((byte)from ^ bVar1) & 0xf;
      for (bucket._4_4_ = 0; bucket._4_4_ < (int)(uint)case_fold_hash1_32[(int)uVar3].count;
          bucket._4_4_ = bucket._4_4_ + 1) {
        if (case_fold_hash1_32[(int)uVar3].list[bucket._4_4_].from == from) {
          *to = case_fold_hash1_32[(int)uVar3].list[bucket._4_4_].to0;
          return 1;
        }
      }
    }
    *to = from;
  }
  return 1;
}

Assistant:

int PHYSFS_caseFold(const PHYSFS_uint32 from, PHYSFS_uint32 *to)
{
    int i;

    if (from < 128)  /* low-ASCII, easy! */
    {
        if ((from >= 'A') && (from <= 'Z'))
            *to = from - ('A' - 'a');
        else
            *to = from;
        return 1;
    } /* if */

    else if (from <= 0xFFFF)
    {
        const PHYSFS_uint8 hash = ((from ^ (from >> 8)) & 0xFF);
        const PHYSFS_uint16 from16 = (PHYSFS_uint16) from;

        {
            const CaseFoldHashBucket1_16 *bucket = &case_fold_hash1_16[hash];
            const int count = (int) bucket->count;
            for (i = 0; i < count; i++)
            {
                const CaseFoldMapping1_16 *mapping = &bucket->list[i];
                if (mapping->from == from16)
                {
                    *to = mapping->to0;
                    return 1;
                } /* if */
            } /* for */
        }

        {
            const CaseFoldHashBucket2_16 *bucket = &case_fold_hash2_16[hash & 15];
            const int count = (int) bucket->count;
            for (i = 0; i < count; i++)
            {
                const CaseFoldMapping2_16 *mapping = &bucket->list[i];
                if (mapping->from == from16)
                {
                    to[0] = mapping->to0;
                    to[1] = mapping->to1;
                    return 2;
                } /* if */
            } /* for */
        }

        {
            const CaseFoldHashBucket3_16 *bucket = &case_fold_hash3_16[hash & 3];
            const int count = (int) bucket->count;
            for (i = 0; i < count; i++)
            {
                const CaseFoldMapping3_16 *mapping = &bucket->list[i];
                if (mapping->from == from16)
                {
                    to[0] = mapping->to0;
                    to[1] = mapping->to1;
                    to[2] = mapping->to2;
                    return 3;
                } /* if */
            } /* for */
        }
    } /* else if */

    else  /* codepoint that doesn't fit in 16 bits. */
    {
        const PHYSFS_uint8 hash = ((from ^ (from >> 8)) & 0xFF);
        const CaseFoldHashBucket1_32 *bucket = &case_fold_hash1_32[hash & 15];
        const int count = (int) bucket->count;
        for (i = 0; i < count; i++)
        {
            const CaseFoldMapping1_32 *mapping = &bucket->list[i];
            if (mapping->from == from)
            {
                *to = mapping->to0;
                return 1;
            } /* if */
        } /* for */
    } /* else */


    /* Not found...there's no remapping for this codepoint. */
    *to = from;
    return 1;
}